

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void helper_msa_ld_w_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,target_ulong addr)

{
  uint idx;
  TCGMemOpIdx oi_00;
  fpr_t *pfVar1;
  tcg_target_ulong tVar2;
  uintptr_t unaff_retaddr;
  TCGMemOpIdx oi;
  wr_t *pwd;
  target_ulong addr_local;
  uint32_t wd_local;
  CPUMIPSState_conflict5 *env_local;
  
  pfVar1 = (env->active_fpu).fpr + wd;
  idx = cpu_mmu_index(env,false);
  oi_00 = make_memop_idx(MO_AMASK|MO_BEUL,idx);
  tVar2 = helper_be_ldul_mmu_mips64((CPUArchState_conflict10 *)env,addr,oi_00,unaff_retaddr);
  pfVar1->fs[0] = (float32)tVar2;
  tVar2 = helper_be_ldul_mmu_mips64((CPUArchState_conflict10 *)env,addr + 4,oi_00,unaff_retaddr);
  pfVar1->fs[1] = (float32)tVar2;
  tVar2 = helper_be_ldul_mmu_mips64((CPUArchState_conflict10 *)env,addr + 8,oi_00,unaff_retaddr);
  pfVar1->fs[2] = (float32)tVar2;
  tVar2 = helper_be_ldul_mmu_mips64((CPUArchState_conflict10 *)env,addr + 0xc,oi_00,unaff_retaddr);
  pfVar1->fs[3] = (float32)tVar2;
  return;
}

Assistant:

void helper_msa_ld_w(CPUMIPSState *env, uint32_t wd,
                     target_ulong addr)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    MEMOP_IDX(DF_WORD)
#if !defined(HOST_WORDS_BIGENDIAN)
    pwd->w[0] = helper_ret_ldul_mmu(env, addr + (0 << DF_WORD), oi, GETPC());
    pwd->w[1] = helper_ret_ldul_mmu(env, addr + (1 << DF_WORD), oi, GETPC());
    pwd->w[2] = helper_ret_ldul_mmu(env, addr + (2 << DF_WORD), oi, GETPC());
    pwd->w[3] = helper_ret_ldul_mmu(env, addr + (3 << DF_WORD), oi, GETPC());
#else
    pwd->w[0] = helper_ret_ldul_mmu(env, addr + (1 << DF_WORD), oi, GETPC());
    pwd->w[1] = helper_ret_ldul_mmu(env, addr + (0 << DF_WORD), oi, GETPC());
    pwd->w[2] = helper_ret_ldul_mmu(env, addr + (3 << DF_WORD), oi, GETPC());
    pwd->w[3] = helper_ret_ldul_mmu(env, addr + (2 << DF_WORD), oi, GETPC());
#endif
}